

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

void Ivy_ManMakeSeq(Ivy_Man_t *p,int nLatches,int *pInits)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Init_t local_4c;
  int local_38;
  int i;
  Ivy_Init_t Init;
  Ivy_Obj_t *pLatch;
  Ivy_Obj_t *pObj;
  int *pInits_local;
  int nLatches_local;
  Ivy_Man_t *p_local;
  
  if (nLatches != 0) {
    iVar2 = Ivy_ManPiNum(p);
    if ((iVar2 <= nLatches) || (iVar2 = Ivy_ManPoNum(p), iVar2 <= nLatches)) {
      __assert_fail("nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1e9,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    iVar2 = Ivy_ManPiNum(p);
    iVar3 = Vec_PtrSize(p->vPis);
    if (iVar2 != iVar3) {
      __assert_fail("Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1ea,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    iVar2 = Ivy_ManPoNum(p);
    iVar3 = Vec_PtrSize(p->vPos);
    if (iVar2 != iVar3) {
      __assert_fail("Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1eb,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    iVar2 = Vec_PtrSize(p->vBufs);
    if (iVar2 != 0) {
      __assert_fail("Vec_PtrSize( p->vBufs ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                    ,0x1ec,"void Ivy_ManMakeSeq(Ivy_Man_t *, int, int *)");
    }
    if (p->fFanout == 0) {
      Ivy_ManStartFanout(p);
    }
    for (local_38 = 0; local_38 < nLatches; local_38 = local_38 + 1) {
      if (pInits == (int *)0x0) {
        local_4c = IVY_INIT_0;
      }
      else {
        local_4c = pInits[local_38];
      }
      iVar2 = Ivy_ManPoNum(p);
      pIVar5 = Ivy_ManPo(p,(iVar2 - nLatches) + local_38);
      pIVar6 = Ivy_ObjChild0(pIVar5);
      pIVar6 = Ivy_Latch(p,pIVar6,local_4c);
      Ivy_ObjDisconnect(p,pIVar5);
      Vec_PtrWriteEntry(p->vObjs,pIVar5->Id,(void *)0x0);
      Ivy_ManRecycleMemory(p,pIVar5);
      iVar2 = Ivy_ManPiNum(p);
      pIVar5 = Ivy_ManPi(p,(iVar2 - nLatches) + local_38);
      *(uint *)&pIVar5->field_0x8 = *(uint *)&pIVar5->field_0x8 & 0xfffffff0 | 7;
      Ivy_ObjConnect(p,pIVar5,pIVar6,(Ivy_Obj_t *)0x0);
      Vec_PtrPush(p->vBufs,pIVar5);
    }
    pVVar1 = p->vPis;
    iVar2 = Ivy_ManPiNum(p);
    Vec_PtrShrink(pVVar1,iVar2 - nLatches);
    pVVar1 = p->vPos;
    iVar2 = Ivy_ManPoNum(p);
    Vec_PtrShrink(pVVar1,iVar2 - nLatches);
    p->nObjs[1] = p->nObjs[1] - nLatches;
    p->nObjs[2] = p->nObjs[2] - nLatches;
    p->nObjs[7] = nLatches + p->nObjs[7];
    p->nDeleted = p->nDeleted + nLatches * -2;
    Ivy_ManCleanup(p);
    Ivy_ManCleanupSeq(p);
    Ivy_ManPropagateBuffers(p,0);
    iVar2 = Ivy_ManBufNum(p);
    if (iVar2 != 0) {
      uVar4 = Ivy_ManBufNum(p);
      printf("The number of remaining buffers is %d.\n",(ulong)uVar4);
    }
    Ivy_ManResetLevels(p);
    iVar2 = Ivy_ManCheck(p);
    if (iVar2 == 0) {
      printf("Ivy_ManMakeSeq(): The check has failed.\n");
    }
  }
  return;
}

Assistant:

void Ivy_ManMakeSeq( Ivy_Man_t * p, int nLatches, int * pInits )
{
    Ivy_Obj_t * pObj, * pLatch;
    Ivy_Init_t Init;
    int i;
    if ( nLatches == 0 )
        return;
    assert( nLatches < Ivy_ManPiNum(p) && nLatches < Ivy_ManPoNum(p) );
    assert( Ivy_ManPiNum(p) == Vec_PtrSize(p->vPis) );
    assert( Ivy_ManPoNum(p) == Vec_PtrSize(p->vPos) );
    assert( Vec_PtrSize( p->vBufs ) == 0 );
    // create fanouts
    if ( p->fFanout == 0 )
        Ivy_ManStartFanout( p );
    // collect the POs to be converted into latches
    for ( i = 0; i < nLatches; i++ )
    {
        // get the latch value
        Init = pInits? (Ivy_Init_t)pInits[i] : IVY_INIT_0;
        // create latch
        pObj = Ivy_ManPo( p, Ivy_ManPoNum(p) - nLatches + i );
        pLatch = Ivy_Latch( p, Ivy_ObjChild0(pObj), Init );
        Ivy_ObjDisconnect( p, pObj );
        // recycle the old PO object
        Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
        Ivy_ManRecycleMemory( p, pObj );
        // convert the corresponding PI to a buffer and connect it to the latch
        pObj = Ivy_ManPi( p, Ivy_ManPiNum(p) - nLatches + i );
        pObj->Type = IVY_BUF;
        Ivy_ObjConnect( p, pObj, pLatch, NULL );
        // save the buffer
        Vec_PtrPush( p->vBufs, pObj );
    }
    // shrink the arrays
    Vec_PtrShrink( p->vPis, Ivy_ManPiNum(p) - nLatches );
    Vec_PtrShrink( p->vPos, Ivy_ManPoNum(p) - nLatches );
    // update the counters of different objects
    p->nObjs[IVY_PI] -= nLatches;
    p->nObjs[IVY_PO] -= nLatches;
    p->nObjs[IVY_BUF] += nLatches;
    p->nDeleted -= 2 * nLatches;
    // remove dangling nodes
    Ivy_ManCleanup(p);
    Ivy_ManCleanupSeq(p);
/* 
    // check for dangling nodes
    Ivy_ManForEachObj( p, pObj, i )
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsPo(pObj) && !Ivy_ObjIsConst1(pObj) )
        {
            assert( Ivy_ObjRefs(pObj) > 0 );
            assert( Ivy_ObjRefs(pObj) == Ivy_ObjFanoutNum(p, pObj) );
        }
*/
    // perform hashing by propagating the buffers
    Ivy_ManPropagateBuffers( p, 0 );
    if ( Ivy_ManBufNum(p) )
        printf( "The number of remaining buffers is %d.\n", Ivy_ManBufNum(p) );
    // fix the levels
    Ivy_ManResetLevels( p );
    // check the resulting network
    if ( !Ivy_ManCheck(p) )
        printf( "Ivy_ManMakeSeq(): The check has failed.\n" );
}